

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O1

CURLcode Curl_SOCKS4(char *proxy_user,char *hostname,int remote_port,int sockindex,connectdata *conn
                    )

{
  curl_proxytype cVar1;
  curl_socket_t sockfd;
  Curl_easy *data;
  bool bVar2;
  CURLcode extraout_EAX;
  int iVar3;
  CURLcode extraout_EAX_00;
  CURLcode CVar4;
  timediff_t tVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  Curl_addrinfo *ai;
  Curl_dns_entry *len;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  Curl_dns_entry *dns;
  curl_proxytype local_194;
  char *local_190;
  uchar socksreq [262];
  char buf [64];
  
  cVar1 = (conn->socks_proxy).proxytype;
  sockfd = conn->sock[sockindex];
  data = conn->data;
  tVar5 = Curl_timeleft(data,(curltime *)0x0,true);
  if (tVar5 < 0) {
    Curl_failf(data,"Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }
  if ((conn->bits).httpproxy == true) {
    pcVar8 = "";
    if (cVar1 == CURLPROXY_SOCKS4A) {
      pcVar8 = "a";
    }
    Curl_infof(conn->data,"SOCKS4%s: connecting to HTTP proxy %s port %d\n",pcVar8,hostname,
               (ulong)(uint)remote_port);
  }
  curlx_nonblock(sockfd,0);
  Curl_infof(data,"SOCKS4 communication to %s:%d\n",hostname,(ulong)(uint)remote_port);
  socksreq[0] = '\x04';
  socksreq[1] = '\x01';
  socksreq[3] = (uchar)remote_port;
  socksreq[2] = (uchar)((uint)remote_port >> 8);
  CVar4 = extraout_EAX;
  if (cVar1 != CURLPROXY_SOCKS4A) {
    iVar3 = Curl_resolv(conn,hostname,remote_port,&dns);
    if (iVar3 == -1) {
      CVar4 = CURLE_COULDNT_RESOLVE_PROXY;
      bVar2 = false;
    }
    else {
      if (iVar3 == 1) {
        Curl_resolver_wait_resolv(conn,&dns);
      }
      if (dns == (Curl_dns_entry *)0x0) {
        ai = (Curl_addrinfo *)0x0;
      }
      else {
        ai = dns->addr;
      }
      if (ai != (Curl_addrinfo *)0x0) {
        local_190 = hostname;
        Curl_printable_address(ai,buf,0x40);
        iVar3 = ai->ai_family;
        if (iVar3 == 2) {
          socksreq._4_4_ = *(undefined4 *)(ai->ai_addr->sa_data + 2);
          Curl_infof(data,"SOCKS4 connect to IPv4 %s (locally resolved)\n",buf);
        }
        else {
          Curl_failf(data,"SOCKS4 connection to %s not supported\n",buf);
        }
        Curl_resolv_unlock(data,dns);
        hostname = local_190;
        if (iVar3 == 2) {
          bVar2 = true;
          CVar4 = extraout_EAX_00;
          goto LAB_00131564;
        }
      }
      bVar2 = false;
      Curl_failf(data,"Failed to resolve \"%s\" for SOCKS4 connect.",hostname);
      CVar4 = CURLE_COULDNT_RESOLVE_HOST;
    }
LAB_00131564:
    if (!bVar2) {
      return CVar4;
    }
  }
  socksreq[8] = '\0';
  local_194 = cVar1;
  if (proxy_user != (char *)0x0) {
    local_190 = hostname;
    sVar6 = strlen(proxy_user);
    if (0xfd < sVar6) {
      Curl_failf(data,"Too long SOCKS proxy name, can\'t use!\n");
      return CURLE_COULDNT_CONNECT;
    }
    memcpy(socksreq + 8,proxy_user,sVar6 + 1);
    hostname = local_190;
  }
  cVar1 = local_194;
  local_190 = (char *)CONCAT44(local_190._4_4_,CVar4);
  sVar6 = strlen((char *)(socksreq + 8));
  if (cVar1 == CURLPROXY_SOCKS4A) {
    socksreq[4] = '\0';
    socksreq[5] = '\0';
    socksreq[6] = '\0';
    socksreq[7] = '\x01';
    sVar7 = strlen(hostname);
    if (0x106 < (long)(sVar7 + sVar6 + 9 + 1)) goto LAB_0013162f;
    lVar10 = sVar7 + 1;
    strcpy((char *)(socksreq + sVar6 + 9),hostname);
  }
  else {
LAB_0013162f:
    lVar10 = 0;
  }
  len = (Curl_dns_entry *)(sVar6 + 9 + lVar10);
  CVar4 = Curl_write_plain(conn,sockfd,socksreq,(size_t)len,(ssize_t *)&dns);
  if ((CVar4 == CURLE_OK) && (dns == len)) {
    if (lVar10 == 0 && local_194 == CURLPROXY_SOCKS4A) {
      sVar6 = strlen(hostname);
      CVar4 = Curl_write_plain(conn,sockfd,hostname,(size_t)(sVar6 + 1),(ssize_t *)&dns);
      if ((CVar4 != CURLE_OK) || (dns != (Curl_dns_entry *)(sVar6 + 1))) goto LAB_001316dc;
    }
    iVar3 = Curl_blockread_all(conn,sockfd,(char *)socksreq,8,(ssize_t *)buf);
    if ((iVar3 != 0) || (buf._0_8_ != 8)) {
      pcVar8 = "Failed to receive SOCKS4 connect request ack.";
      goto LAB_001316ec;
    }
    if (socksreq[0] != '\0') {
      pcVar8 = "SOCKS4 reply has wrong version, version should be 4.";
      goto LAB_001316ec;
    }
    uVar11 = (ulong)socksreq[1];
    switch(socksreq[1]) {
    case 'Z':
      pcVar8 = "";
      if (local_194 == CURLPROXY_SOCKS4A) {
        pcVar8 = "a";
      }
      Curl_infof(data,"SOCKS4%s request granted.\n",pcVar8);
      bVar2 = true;
      CVar4 = (CURLcode)local_190;
      goto LAB_001316fd;
    case '[':
      uVar9 = (ulong)(ushort)(socksreq._2_2_ << 8 | (ushort)socksreq._2_2_ >> 8);
      pcVar8 = 
      "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected or failed.";
      uVar11 = 0x5b;
      break;
    case '\\':
      uVar9 = (ulong)(ushort)(socksreq._2_2_ << 8 | (ushort)socksreq._2_2_ >> 8);
      pcVar8 = 
      "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because SOCKS server cannot connect to identd on the client."
      ;
      uVar11 = 0x5c;
      break;
    case ']':
      uVar9 = (ulong)(ushort)(socksreq._2_2_ << 8 | (ushort)socksreq._2_2_ >> 8);
      pcVar8 = 
      "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because the client program and identd report different user-ids."
      ;
      uVar11 = 0x5d;
      break;
    default:
      uVar9 = (ulong)(ushort)(socksreq._2_2_ << 8 | (ushort)socksreq._2_2_ >> 8);
      pcVar8 = "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), Unknown.";
    }
    Curl_failf(data,pcVar8,(ulong)socksreq[4],(ulong)socksreq[5],(ulong)socksreq[6],
               (ulong)socksreq[7],uVar9,uVar11);
  }
  else {
LAB_001316dc:
    pcVar8 = "Failed to send SOCKS4 connect request.";
LAB_001316ec:
    Curl_failf(data,pcVar8);
  }
  bVar2 = false;
  CVar4 = CURLE_COULDNT_CONNECT;
LAB_001316fd:
  if (bVar2) {
    curlx_nonblock(sockfd,1);
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

CURLcode Curl_SOCKS4(const char *proxy_user,
                     const char *hostname,
                     int remote_port,
                     int sockindex,
                     struct connectdata *conn)
{
  const bool protocol4a =
    (conn->socks_proxy.proxytype == CURLPROXY_SOCKS4A) ? TRUE : FALSE;
#define SOCKS4REQLEN 262
  unsigned char socksreq[SOCKS4REQLEN]; /* room for SOCKS4 request incl. user
                                           id */
  CURLcode code;
  curl_socket_t sock = conn->sock[sockindex];
  struct Curl_easy *data = conn->data;

  if(Curl_timeleft(data, NULL, TRUE) < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(conn->bits.httpproxy)
    infof(conn->data, "SOCKS4%s: connecting to HTTP proxy %s port %d\n",
          protocol4a ? "a" : "", hostname, remote_port);

  (void)curlx_nonblock(sock, FALSE);

  infof(data, "SOCKS4 communication to %s:%d\n", hostname, remote_port);

  /*
   * Compose socks4 request
   *
   * Request format
   *
   *     +----+----+----+----+----+----+----+----+----+----+....+----+
   *     | VN | CD | DSTPORT |      DSTIP        | USERID       |NULL|
   *     +----+----+----+----+----+----+----+----+----+----+....+----+
   * # of bytes:  1    1      2              4           variable       1
   */

  socksreq[0] = 4; /* version (SOCKS4) */
  socksreq[1] = 1; /* connect */
  socksreq[2] = (unsigned char)((remote_port >> 8) & 0xff); /* PORT MSB */
  socksreq[3] = (unsigned char)(remote_port & 0xff);        /* PORT LSB */

  /* DNS resolve only for SOCKS4, not SOCKS4a */
  if(!protocol4a) {
    struct Curl_dns_entry *dns;
    Curl_addrinfo *hp = NULL;
    int rc;

    rc = Curl_resolv(conn, hostname, remote_port, &dns);

    if(rc == CURLRESOLV_ERROR)
      return CURLE_COULDNT_RESOLVE_PROXY;

    if(rc == CURLRESOLV_PENDING)
      /* ignores the return code, but 'dns' remains NULL on failure */
      (void)Curl_resolver_wait_resolv(conn, &dns);

    /*
     * We cannot use 'hostent' as a struct that Curl_resolv() returns.  It
     * returns a Curl_addrinfo pointer that may not always look the same.
     */
    if(dns)
      hp = dns->addr;
    if(hp) {
      char buf[64];
      Curl_printable_address(hp, buf, sizeof(buf));

      if(hp->ai_family == AF_INET) {
        struct sockaddr_in *saddr_in;

        saddr_in = (struct sockaddr_in *)(void *)hp->ai_addr;
        socksreq[4] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[0];
        socksreq[5] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[1];
        socksreq[6] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[2];
        socksreq[7] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[3];

        infof(data, "SOCKS4 connect to IPv4 %s (locally resolved)\n", buf);
      }
      else {
        hp = NULL; /* fail! */

        failf(data, "SOCKS4 connection to %s not supported\n", buf);
      }

      Curl_resolv_unlock(data, dns); /* not used anymore from now on */
    }
    if(!hp) {
      failf(data, "Failed to resolve \"%s\" for SOCKS4 connect.",
            hostname);
      return CURLE_COULDNT_RESOLVE_HOST;
    }
  }

  /*
   * This is currently not supporting "Identification Protocol (RFC1413)".
   */
  socksreq[8] = 0; /* ensure empty userid is NUL-terminated */
  if(proxy_user) {
    size_t plen = strlen(proxy_user);
    if(plen >= sizeof(socksreq) - 8) {
      failf(data, "Too long SOCKS proxy name, can't use!\n");
      return CURLE_COULDNT_CONNECT;
    }
    /* copy the proxy name WITH trailing zero */
    memcpy(socksreq + 8, proxy_user, plen + 1);
  }

  /*
   * Make connection
   */
  {
    int result;
    ssize_t actualread;
    ssize_t written;
    ssize_t hostnamelen = 0;
    ssize_t packetsize = 9 +
      strlen((char *)socksreq + 8); /* size including NUL */

    /* If SOCKS4a, set special invalid IP address 0.0.0.x */
    if(protocol4a) {
      socksreq[4] = 0;
      socksreq[5] = 0;
      socksreq[6] = 0;
      socksreq[7] = 1;
      /* If still enough room in buffer, also append hostname */
      hostnamelen = (ssize_t)strlen(hostname) + 1; /* length including NUL */
      if(packetsize + hostnamelen <= SOCKS4REQLEN)
        strcpy((char *)socksreq + packetsize, hostname);
      else
        hostnamelen = 0; /* Flag: hostname did not fit in buffer */
    }

    /* Send request */
    code = Curl_write_plain(conn, sock, (char *)socksreq,
                            packetsize + hostnamelen,
                            &written);
    if(code || (written != packetsize + hostnamelen)) {
      failf(data, "Failed to send SOCKS4 connect request.");
      return CURLE_COULDNT_CONNECT;
    }
    if(protocol4a && hostnamelen == 0) {
      /* SOCKS4a with very long hostname - send that name separately */
      hostnamelen = (ssize_t)strlen(hostname) + 1;
      code = Curl_write_plain(conn, sock, (char *)hostname, hostnamelen,
                              &written);
      if(code || (written != hostnamelen)) {
        failf(data, "Failed to send SOCKS4 connect request.");
        return CURLE_COULDNT_CONNECT;
      }
    }

    packetsize = 8; /* receive data size */

    /* Receive response */
    result = Curl_blockread_all(conn, sock, (char *)socksreq, packetsize,
                                &actualread);
    if(result || (actualread != packetsize)) {
      failf(data, "Failed to receive SOCKS4 connect request ack.");
      return CURLE_COULDNT_CONNECT;
    }

    /*
     * Response format
     *
     *     +----+----+----+----+----+----+----+----+
     *     | VN | CD | DSTPORT |      DSTIP        |
     *     +----+----+----+----+----+----+----+----+
     * # of bytes:  1    1      2              4
     *
     * VN is the version of the reply code and should be 0. CD is the result
     * code with one of the following values:
     *
     * 90: request granted
     * 91: request rejected or failed
     * 92: request rejected because SOCKS server cannot connect to
     *     identd on the client
     * 93: request rejected because the client program and identd
     *     report different user-ids
     */

    /* wrong version ? */
    if(socksreq[0] != 0) {
      failf(data,
            "SOCKS4 reply has wrong version, version should be 4.");
      return CURLE_COULDNT_CONNECT;
    }

    /* Result */
    switch(socksreq[1]) {
    case 90:
      infof(data, "SOCKS4%s request granted.\n", protocol4a?"a":"");
      break;
    case 91:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", request rejected or failed.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
            (unsigned char)socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    case 92:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", request rejected because SOCKS server cannot connect to "
            "identd on the client.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
            (unsigned char)socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    case 93:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", request rejected because the client program and identd "
            "report different user-ids.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
            (unsigned char)socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    default:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", Unknown.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
            (unsigned char)socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    }
  }

  (void)curlx_nonblock(sock, TRUE);

  return CURLE_OK; /* Proxy was successful! */
}